

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void update_op_reg_list(m68k_info *info,cs_m68k_op *op,int write)

{
  m68k_info *info_00;
  undefined4 in_EDX;
  m68k_info *in_RSI;
  int in_stack_ffffffffffffffd8;
  m68k_reg in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  
  info_00 = (m68k_info *)(ulong)((in_RSI->extension).operands[0].field_0.reg - M68K_REG_D0);
  switch(info_00) {
  case (m68k_info *)0x0:
    add_reg_to_rw_list(info_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    break;
  case (m68k_info *)0x2:
    update_am_reg_list(in_RSI,(cs_m68k_op *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
    break;
  case (m68k_info *)0x5:
    update_reg_list_regbits
              (info_00,(cs_m68k_op *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0
              );
    break;
  case (m68k_info *)0x6:
    add_reg_to_rw_list(info_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    add_reg_to_rw_list(info_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void update_op_reg_list(m68k_info *info, cs_m68k_op *op, int write)
{
	switch ((int)op->type) {
		case M68K_OP_REG:
			add_reg_to_rw_list(info, op->reg, write);
			break;

		case M68K_OP_MEM:
			update_am_reg_list(info, op, write);
			break;

		case M68K_OP_REG_BITS:
			update_reg_list_regbits(info, op, write);
			break;

		case M68K_OP_REG_PAIR:
			add_reg_to_rw_list(info, M68K_REG_D0 + op->reg_pair.reg_0, write);
			add_reg_to_rw_list(info, M68K_REG_D0 + op->reg_pair.reg_1, write);
			break;
	}
}